

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::acquireFboAttachmentReference(ReferenceContext *this,Attachment *attachment)

{
  int *piVar1;
  Texture *pTVar2;
  TestError *this_00;
  
  if (attachment->type == ATTACHMENTTYPE_RENDERBUFFER) {
    if (attachment->name == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x78a);
    }
    else {
      pTVar2 = (Texture *)
               rc::ObjectManager<sglr::rc::Renderbuffer>::find
                         (&this->m_renderbuffers,attachment->name);
      if (pTVar2 != (Texture *)0x0) goto LAB_01522233;
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"rbo",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x78c);
    }
  }
  else {
    if (attachment->type != ATTACHMENTTYPE_TEXTURE) {
      return;
    }
    if (attachment->name == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x781);
    }
    else {
      pTVar2 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,attachment->name);
      if (pTVar2 != (Texture *)0x0) {
LAB_01522233:
        piVar1 = &(pTVar2->super_NamedObject).m_refCount;
        *piVar1 = *piVar1 + 1;
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x783);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReferenceContext::acquireFboAttachmentReference (const Framebuffer::Attachment& attachment)
{
	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			TCU_CHECK(attachment.name != 0);
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);
			m_textures.acquireReference(texture);
			break;
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			TCU_CHECK(attachment.name != 0);
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);
			m_renderbuffers.acquireReference(rbo);
			break;
		}

		default:
			break; // Silently ignore
	}
}